

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTableDrivenParser.cpp
# Opt level: O0

void parse(void)

{
  bool bVar1;
  istream *piVar2;
  ostream *this;
  char *pcVar3;
  LexicalError *err;
  SyntacticAnalyzer syntacticAnalyzer;
  string buffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  def;
  allocator local_1a9;
  string local_1a8 [32];
  istringstream local_188 [8];
  istringstream in;
  
  pcVar3 = BNF;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,pcVar3,&local_1a9);
  std::__cxx11::istringstream::istringstream(local_188,local_1a8,_S_in);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&buffer.field_2 + 8));
  std::__cxx11::string::string
            ((string *)
             ((long)&syntacticAnalyzer.stack.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_188,
                        (string *)
                        ((long)&syntacticAnalyzer.stack.c.
                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&buffer.field_2 + 8),
                (value_type *)
                ((long)&syntacticAnalyzer.stack.c.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  }
  MyCompiler::SyntacticAnalyzer::SyntacticAnalyzer
            ((SyntacticAnalyzer *)&err,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&buffer.field_2 + 8));
  bVar1 = MyCompiler::SyntacticAnalyzer::tryParse((SyntacticAnalyzer *)&err,(istream *)&std::cin);
  pcVar3 = "invalid syntax";
  if (bVar1) {
    pcVar3 = "ok";
  }
  this = std::operator<<((ostream *)&std::cout,pcVar3);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  MyCompiler::SyntacticAnalyzer::~SyntacticAnalyzer((SyntacticAnalyzer *)&err);
  std::__cxx11::string::~string
            ((string *)
             ((long)&syntacticAnalyzer.stack.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&buffer.field_2 + 8));
  std::__cxx11::istringstream::~istringstream(local_188);
  return;
}

Assistant:

void parse()
{
    std::istringstream in(BNF);
    std::vector<std::string> def;
    std::string buffer;
    while (getline(in, buffer))
        def.push_back(buffer);
    MyCompiler::SyntacticAnalyzer syntacticAnalyzer(def);

    try
    {
        std::cout << (syntacticAnalyzer.tryParse(std::cin) ? "ok" : "invalid syntax") << std::endl;
    }
    catch (MyCompiler::LexicalError &err)
    {
        std::cout << "invalid token" << std::endl;
    }
}